

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O1

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::NextUp(CordRepBtreeNavigator *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  CordRepBtree *pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((ulong)(this->node_[0]->super_CordRep).storage[2] - 1 != (ulong)this->index_[0]) {
    __assert_fail("index_[0] == node_[0]->back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xe4,"CordRep *absl::cord_internal::CordRepBtreeNavigator::NextUp()");
  }
  uVar6 = (ulong)(uint)this->height_;
  if (this->height_ < 1) {
    uVar6 = 0;
  }
  uVar7 = 0;
  do {
    if (uVar6 == uVar7) {
      return (CordRep *)0x0;
    }
    lVar3 = uVar7 + 1;
    pCVar4 = this->node_[uVar7 + 1];
    uVar5 = (ulong)(this->index_ + 1)[uVar7] + 1;
    uVar7 = lVar3;
  } while (uVar5 == (pCVar4->super_CordRep).storage[2]);
  this->index_[lVar3] = (uint8_t)uVar5;
  lVar3 = (long)(int)lVar3;
  do {
    if (uVar5 < (pCVar4->super_CordRep).storage[1]) goto LAB_0029a80d;
    if ((pCVar4->super_CordRep).storage[2] <= uVar5) goto LAB_0029a82c;
    pCVar4 = (CordRepBtree *)pCVar4->edges_[uVar5];
    if ((pCVar4->super_CordRep).tag != '\x03') {
      __assert_fail("IsBtree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
    }
    this->node_[lVar3 + -1] = pCVar4;
    bVar1 = (pCVar4->super_CordRep).storage[1];
    uVar5 = (ulong)bVar1;
    this->index_[lVar3 + -1] = bVar1;
    bVar2 = 1 < lVar3;
    lVar3 = lVar3 + -1;
  } while (bVar2);
  if ((pCVar4->super_CordRep).storage[1] <= bVar1) {
    if (bVar1 < (pCVar4->super_CordRep).storage[2]) {
      return pCVar4->edges_[uVar5];
    }
LAB_0029a82c:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
LAB_0029a80d:
  __assert_fail("index >= begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

inline CordRep* CordRepBtreeNavigator::NextUp() {
  assert(index_[0] == node_[0]->back());
  CordRepBtree* edge;
  size_t index;
  int height = 0;
  do {
    if (++height > height_) return nullptr;
    edge = node_[height];
    index = index_[height] + 1;
  } while (index == edge->end());
  index_[height] = static_cast<uint8_t>(index);
  do {
    node_[--height] = edge = edge->Edge(index)->btree();
    index_[height] = static_cast<uint8_t>(index = edge->begin());
  } while (height > 0);
  return edge->Edge(index);
}